

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O1

void __thiscall prometheus::Histogram::Reset(Histogram *this)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pointer pCVar3;
  ulong uVar4;
  long lVar5;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    pCVar3 = (this->bucket_counts_).
             super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->bucket_counts_).
        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar3) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        Counter::Reset((Counter *)((long)&(pCVar3->gauge_).value_._M_i + lVar5));
        uVar4 = uVar4 + 1;
        pCVar3 = (this->bucket_counts_).
                 super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 8;
      } while (uVar4 < (ulong)((long)(this->bucket_counts_).
                                     super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
              );
    }
    Gauge::Set(&this->sum_,0.0);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void Histogram::Reset() {
  std::lock_guard<std::mutex> lock(mutex_);
  for (std::size_t i = 0; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Reset();
  }
  sum_.Set(0);
}